

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::GetSecurityPolicy
          (Error *__return_storage_ptr__,CommissionerApp *this,SecurityPolicy *aSecurityPolicy)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar5;
  format_args args;
  format_args args_00;
  writer write;
  string local_b8;
  ErrorCode local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  writer local_70;
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the commissioner is not active";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar4 = "the commissioner is not active";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar3 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_68);
      }
      pcVar4 = pcVar3;
    } while (pcVar3 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)0x233cbc,(string_view)ZEXT816(0x1e),args_00);
    local_98 = kInvalidState;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  else {
    if (((this->mActiveDataset).mPresentFlags & 0x40) != 0) {
      aSecurityPolicy->mRotationTime = (this->mActiveDataset).mSecurityPolicy.mRotationTime;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&aSecurityPolicy->mFlags,&(this->mActiveDataset).mSecurityPolicy.mFlags);
      return __return_storage_ptr__;
    }
    local_68.types_[0] = none_type;
    pcVar4 = "cannot find valid Security Policy in Active Operational Dataset";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot find valid Security Policy in Active Operational Dataset";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x3f;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_70.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar4 == "") break;
      pcVar3 = pcVar4;
      if (*pcVar4 == '{') {
LAB_00167af2:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,pcVar4,pcVar3);
        pcVar4 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar3,"",&local_68);
        bVar5 = true;
      }
      else {
        pcVar3 = pcVar4 + 1;
        bVar5 = pcVar3 != "";
        if (bVar5) {
          if (*pcVar3 != '{') {
            pcVar1 = pcVar4 + 2;
            do {
              pcVar3 = pcVar1;
              bVar5 = pcVar3 != "";
              if (pcVar3 == "") goto LAB_00167aee;
              pcVar1 = pcVar3 + 1;
            } while (*pcVar3 != '{');
          }
          bVar5 = true;
        }
LAB_00167aee:
        if (bVar5) goto LAB_00167af2;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,pcVar4,"");
        bVar5 = false;
      }
    } while (bVar5);
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"cannot find valid Security Policy in Active Operational Dataset",
               (string_view)ZEXT816(0x3f),args);
    local_98 = kNotFound;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  __return_storage_ptr__->mCode = local_98;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetSecurityPolicy(SecurityPolicy &aSecurityPolicy) const
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrExit(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit,
                 error = ERROR_NOT_FOUND("cannot find valid Security Policy in Active Operational Dataset"));
    aSecurityPolicy = mActiveDataset.mSecurityPolicy;

exit:
    return error;
}